

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

char * stbi_zlib_decode_noheader_malloc(char *buffer,int len,int *outlen)

{
  int iVar1;
  void *pvVar2;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  char *p;
  stbi__zbuf a;
  stbi__zbuf *in_stack_ffffffffffffeff0;
  undefined4 local_1008;
  undefined8 local_1000;
  undefined8 local_8;
  
  pvVar2 = stbi__malloc(0x109398);
  if (pvVar2 == (void *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = stbi__do_zlib(in_stack_ffffffffffffeff0,(char *)(in_RDI + in_ESI),
                          (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)pvVar2 >> 0x20));
    if (iVar1 == 0) {
      free(local_1000);
      local_8 = (char *)0x0;
    }
    else {
      if (in_RDX != (int *)0x0) {
        *in_RDX = local_1008 - (int)local_1000;
      }
      local_8 = local_1000;
    }
  }
  return local_8;
}

Assistant:

STBIDEF char *stbi_zlib_decode_noheader_malloc(char const *buffer, int len, int *outlen)
{
   stbi__zbuf a;
   char *p = (char *) stbi__malloc(16384);
   if (p == NULL) return NULL;
   a.zbuffer = (stbi_uc *) buffer;
   a.zbuffer_end = (stbi_uc *) buffer+len;
   if (stbi__do_zlib(&a, p, 16384, 1, 0)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      STBI_FREE(a.zout_start);
      return NULL;
   }
}